

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O3

bool __thiscall
cmGlobalNinjaGenerator::WriteTargetCleanAdditional(cmGlobalNinjaGenerator *this,ostream *os)

{
  _Rb_tree_header *p_Var1;
  cmLocalGenerator *pcVar2;
  _Alloc_hider _Var3;
  int iVar4;
  string *psVar5;
  iterator iVar6;
  ostream *poVar7;
  _Rb_tree_node_base *p_Var8;
  mapped_type *pmVar9;
  bool bVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *config;
  pointer __k;
  pointer puVar11;
  pointer pbVar12;
  undefined8 in_R8;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string_view str;
  string_view source;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  string cleanScriptRel;
  string cleanScriptAbs;
  cmGeneratedFileStream fout;
  undefined1 local_3f8 [32];
  size_type local_3d8;
  pointer local_3d0;
  string local_3c8;
  pointer local_3a8;
  string local_3a0;
  ostream *local_380;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_378;
  string local_360;
  key_type *local_340;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_338;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_330;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_318;
  char *local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  undefined1 local_298 [8];
  pointer local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  _Alloc_hider local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  undefined1 local_258 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  _Alloc_hider local_238;
  pointer local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  _Alloc_hider local_218;
  pointer local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  _Alloc_hider local_1f8;
  pointer local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  _Alloc_hider local_1d8;
  pointer local_1d0;
  undefined1 local_1c8 [16];
  _Alloc_hider local_1b8;
  _Base_ptr local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  _Alloc_hider local_198;
  size_type local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  bool local_178;
  
  puVar11 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
            super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_380 = os;
  if ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
      super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish == puVar11) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
  }
  local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_360,"CMakeFiles/clean_additional.cmake","");
  local_3a8 = puVar11;
  psVar5 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_
                     ((puVar11->_M_t).
                      super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                      .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl);
  local_290 = (psVar5->_M_dataplus)._M_p;
  local_298 = (undefined1  [8])psVar5->_M_string_length;
  local_3f8._8_8_ = local_3f8 + 0x10;
  local_3f8._0_8_ = (char *)0x1;
  local_3f8[0x10] = 0x2f;
  local_288._M_allocated_capacity = 1;
  local_278._M_p = (pointer)local_360._M_string_length;
  local_270 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_dataplus._M_p;
  views._M_len = 3;
  views._M_array = (iterator)local_298;
  local_288._8_8_ = local_3f8._8_8_;
  cmCatViews_abi_cxx11_(&local_2f8,views);
  cmMakefile::GetGeneratorConfigs_abi_cxx11_
            (&local_378,
             (cmMakefile *)
             (((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.Makefiles.
               super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_t).
             super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t,
             IncludeEmptyConfig);
  pbVar12 = local_378.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (local_378.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_378.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    p_Var1 = &(this->Configs)._M_t._M_impl.super__Rb_tree_header;
    __k = local_378.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    do {
      iVar6 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>_>
              ::find(&(this->Configs)._M_t,__k);
      if (((_Rb_tree_header *)iVar6._M_node != p_Var1) &&
         (iVar6._M_node[3]._M_parent != (_Base_ptr)0x0)) {
        cmGeneratedFileStream::cmGeneratedFileStream
                  ((cmGeneratedFileStream *)local_298,&local_2f8,false,None);
        puVar11 = local_3a8;
        if ((*(byte *)((long)&local_278._M_p + *(long *)((long)local_298 + -0x18)) & 5) == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_298,
                     "# Additional clean files\ncmake_minimum_required(VERSION 3.16)\n",0x3e);
          local_340 = local_378.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          if (local_378.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_378.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            pbVar12 = local_378.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            do {
              iVar6 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>_>
                      ::find(&(this->Configs)._M_t,pbVar12);
              if (((_Rb_tree_header *)iVar6._M_node != p_Var1) &&
                 (iVar6._M_node[3]._M_parent != (_Base_ptr)0x0)) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_298,
                           "\nif(\"${CONFIG}\" STREQUAL \"\" OR \"${CONFIG}\" STREQUAL \"",0x35);
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_298,(pbVar12->_M_dataplus)._M_p,
                                    pbVar12->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\")\n",3);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_298,"  file(REMOVE_RECURSE\n",0x16);
                for (p_Var8 = iVar6._M_node[2]._M_right;
                    p_Var8 != (_Rb_tree_node_base *)&iVar6._M_node[2]._M_parent;
                    p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"  ",2);
                  psVar5 = ConvertToNinjaPath(this,(string *)(p_Var8 + 1));
                  str._M_str = (char *)0x0;
                  str._M_len = (size_t)(psVar5->_M_dataplus)._M_p;
                  cmOutputConverter::EscapeForCMake_abi_cxx11_
                            ((string *)local_3f8,(cmOutputConverter *)psVar5->_M_string_length,str,
                             (WrapQuotes)in_R8);
                  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)local_298,(char *)local_3f8._0_8_,local_3f8._8_8_);
                  local_3c8._M_dataplus._M_p._0_1_ = 10;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_3c8,1);
                  if ((undefined1 *)local_3f8._0_8_ != local_3f8 + 0x10) {
                    operator_delete((void *)local_3f8._0_8_,local_3f8._16_8_ + 1);
                  }
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"  )\n",4);
                puVar11 = local_3a8;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_298,"endif()\n",8);
              }
              pbVar12 = pbVar12 + 1;
            } while (pbVar12 != local_340);
          }
          cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&((puVar11->_M_t).
                        super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                        .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl)->Makefile->
                       OutputFiles,&local_2f8);
          local_318 = &local_308;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_318,"CLEAN_ADDITIONAL","");
          local_298 = (undefined1  [8])&local_288;
          if (local_318 == &local_308) {
            local_288._8_8_ = local_308._8_8_;
          }
          else {
            local_298 = (undefined1  [8])local_318;
          }
          local_288._M_allocated_capacity = (ulong)(uint7)local_308._M_allocated_capacity._1_7_ << 8
          ;
          local_290 = local_310;
          local_310 = (char *)0x0;
          local_308._M_local_buf[0] = '\0';
          local_270 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0;
          local_268._M_allocated_capacity = local_268._M_allocated_capacity & 0xffffffffffffff00;
          local_258._0_8_ = local_258 + 0x10;
          local_258._8_8_ = (pointer)0x0;
          local_248._M_local_buf[0] = '\0';
          local_238._M_p = (pointer)&local_228;
          local_230 = (pointer)0x0;
          local_228._M_local_buf[0] = '\0';
          local_218._M_p = (pointer)&local_208;
          local_210 = (pointer)0x0;
          local_208._M_local_buf[0] = '\0';
          local_1f8._M_p = (pointer)&local_1e8;
          local_1f0 = (pointer)0x0;
          local_1e8._M_local_buf[0] = '\0';
          local_1d8._M_p = local_1c8;
          local_1d0 = (pointer)0x0;
          local_1c8[0] = '\0';
          local_1b8._M_p = (pointer)&local_1a8;
          local_1b0 = (_Base_ptr)0x0;
          local_1a8._M_allocated_capacity = local_1a8._M_allocated_capacity & 0xffffffffffffff00;
          local_190 = 0;
          local_188._M_local_buf[0] = '\0';
          local_178 = false;
          local_318 = &local_308;
          local_278._M_p = (pointer)&local_268;
          local_198._M_p = (pointer)&local_188;
          CMakeCmd_abi_cxx11_(&local_3a0,this);
          _Var3._M_p = local_3a0._M_dataplus._M_p;
          pcVar2 = (local_3a8->_M_t).
                   super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                   .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl;
          NinjaOutputPath(&local_2d8,this,&local_360);
          source._M_str = local_2d8._M_dataplus._M_p;
          source._M_len = local_2d8._M_string_length;
          cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                    (&local_2b8,&pcVar2->super_cmOutputConverter,source,SHELL);
          local_3f8._0_8_ = local_3a0._M_string_length;
          local_3f8._8_8_ = _Var3._M_p;
          local_3f8._16_8_ = 0x15;
          local_3f8._24_8_ = " -DCONFIG=$CONFIG -P ";
          local_3d8 = local_2b8._M_string_length;
          local_3d0 = local_2b8._M_dataplus._M_p;
          views_00._M_len = 3;
          views_00._M_array = (iterator)local_3f8;
          cmCatViews_abi_cxx11_(&local_3c8,views_00);
          std::__cxx11::string::operator=((string *)&local_278,(string *)&local_3c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
            operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
            operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
            operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
            operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::_M_replace((ulong)local_258,0,(char *)local_258._8_8_,0x7803af);
          std::__cxx11::string::_M_replace((ulong)&local_238,0,(char *)local_230,0x7803cc);
          WriteRule((ostream *)
                    (this->RulesFileStream)._M_t.
                    super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                    .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
                    (cmNinjaRule *)local_298);
          cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_298);
          local_338 = &local_328;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_338,"CLEAN_ADDITIONAL","");
          local_298 = (undefined1  [8])&local_288;
          local_290 = (pointer)0x0;
          local_288._M_allocated_capacity = local_288._M_allocated_capacity & 0xffffffffffffff00;
          if (local_338 == &local_328) {
            local_268._8_8_ = local_328._8_8_;
            local_278._M_p = (pointer)&local_268;
          }
          else {
            local_278._M_p = (pointer)local_338;
          }
          local_270 = local_330;
          local_330 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0;
          local_328._M_local_buf[0] = '\0';
          local_1c8._8_4_ = 0;
          local_1b8._M_p = (pointer)0x0;
          local_338 = &local_328;
          memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_258,0,0x90);
          local_1a8._8_8_ = 0;
          local_190 = 0;
          local_188._M_local_buf[0] = '\0';
          local_1b0 = (_Base_ptr)(local_1c8 + 8);
          local_1a8._M_allocated_capacity = (size_type)(_Base_ptr)(local_1c8 + 8);
          local_198._M_p = (pointer)&local_188;
          std::__cxx11::string::_M_replace((ulong)local_298,0,(char *)0x0,0x7803f0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::emplace_back<>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_258);
          if (local_378.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_378.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            pbVar12 = local_378.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            do {
              local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_3a0,"CMakeFiles/clean.additional","");
              NinjaOutputPath(&local_3c8,this,&local_3a0);
              (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                _vptr_cmGlobalGenerator[0x48])((key_type *)local_3f8,this,&local_3c8);
              std::__cxx11::string::operator=((string *)local_258._0_8_,(string *)local_3f8);
              if ((undefined1 *)local_3f8._0_8_ != local_3f8 + 0x10) {
                operator_delete((void *)local_3f8._0_8_,local_3f8._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
                operator_delete(local_3c8._M_dataplus._M_p,
                                local_3c8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
                operator_delete(local_3a0._M_dataplus._M_p,
                                local_3a0.field_2._M_allocated_capacity + 1);
              }
              local_3f8._0_8_ = local_3f8 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_3f8,"CONFIG","");
              pmVar9 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)local_1c8,(key_type *)local_3f8);
              std::__cxx11::string::_M_assign((string *)pmVar9);
              if ((undefined1 *)local_3f8._0_8_ != local_3f8 + 0x10) {
                operator_delete((void *)local_3f8._0_8_,local_3f8._16_8_ + 1);
              }
              WriteBuild(this,local_380,(cmNinjaBuild *)local_298,0,(bool *)0x0);
              pbVar12 = pbVar12 + 1;
            } while (pbVar12 !=
                     local_378.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          }
          iVar4 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                    _vptr_cmGlobalGenerator[0x26])();
          if ((char)iVar4 != '\0') {
            local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_3c8,"CMakeFiles/clean.additional","");
            NinjaOutputPath((string *)local_3f8,this,&local_3c8);
            std::__cxx11::string::operator=((string *)local_258._0_8_,(string *)local_3f8);
            if ((undefined1 *)local_3f8._0_8_ != local_3f8 + 0x10) {
              operator_delete((void *)local_3f8._0_8_,local_3f8._16_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
              operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1
                             );
            }
            local_3f8._0_8_ = local_3f8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_3f8,"CONFIG","");
            pmVar9 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)local_1c8,(key_type *)local_3f8);
            std::__cxx11::string::_M_replace
                      ((ulong)pmVar9,0,(char *)pmVar9->_M_string_length,0x7bf049);
            if ((undefined1 *)local_3f8._0_8_ != local_3f8 + 0x10) {
              operator_delete((void *)local_3f8._0_8_,local_3f8._16_8_ + 1);
            }
            WriteBuild(this,local_380,(cmNinjaBuild *)local_298,0,(bool *)0x0);
          }
          cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_298);
          bVar10 = true;
          goto LAB_003e405c;
        }
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
        goto LAB_003e405a;
      }
      __k = __k + 1;
    } while (__k != pbVar12);
  }
  cmsys::SystemTools::RemoveFile(&local_2f8);
LAB_003e405a:
  bVar10 = false;
LAB_003e405c:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_378);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
  }
  return bVar10;
}

Assistant:

bool cmGlobalNinjaGenerator::WriteTargetCleanAdditional(std::ostream& os)
{
  const auto& lgr = this->LocalGenerators.at(0);
  std::string cleanScriptRel = "CMakeFiles/clean_additional.cmake";
  std::string cleanScriptAbs =
    cmStrCat(lgr->GetBinaryDirectory(), '/', cleanScriptRel);
  std::vector<std::string> configs =
    this->Makefiles[0]->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);

  // Check if there are additional files to clean
  bool empty = true;
  for (auto const& config : configs) {
    auto const it = this->Configs.find(config);
    if (it != this->Configs.end() &&
        !it->second.AdditionalCleanFiles.empty()) {
      empty = false;
      break;
    }
  }
  if (empty) {
    // Remove cmake clean script file if it exists
    cmSystemTools::RemoveFile(cleanScriptAbs);
    return false;
  }

  // Write cmake clean script file
  {
    cmGeneratedFileStream fout(cleanScriptAbs);
    if (!fout) {
      return false;
    }
    fout << "# Additional clean files\ncmake_minimum_required(VERSION 3.16)\n";
    for (auto const& config : configs) {
      auto const it = this->Configs.find(config);
      if (it != this->Configs.end() &&
          !it->second.AdditionalCleanFiles.empty()) {
        fout << "\nif(\"${CONFIG}\" STREQUAL \"\" OR \"${CONFIG}\" STREQUAL \""
             << config << "\")\n";
        fout << "  file(REMOVE_RECURSE\n";
        for (std::string const& acf : it->second.AdditionalCleanFiles) {
          fout << "  "
               << cmOutputConverter::EscapeForCMake(
                    this->ConvertToNinjaPath(acf))
               << '\n';
        }
        fout << "  )\n";
        fout << "endif()\n";
      }
    }
  }
  // Register clean script file
  lgr->GetMakefile()->AddCMakeOutputFile(cleanScriptAbs);

  // Write rule
  {
    cmNinjaRule rule("CLEAN_ADDITIONAL");
    rule.Command = cmStrCat(
      this->CMakeCmd(), " -DCONFIG=$CONFIG -P ",
      lgr->ConvertToOutputFormat(this->NinjaOutputPath(cleanScriptRel),
                                 cmOutputConverter::SHELL));
    rule.Description = "Cleaning additional files...";
    rule.Comment = "Rule for cleaning additional files.";
    WriteRule(*this->RulesFileStream, rule);
  }

  // Write build
  {
    cmNinjaBuild build("CLEAN_ADDITIONAL");
    build.Comment = "Clean additional files.";
    build.Outputs.emplace_back();
    for (auto const& config : configs) {
      build.Outputs.front() = this->BuildAlias(
        this->NinjaOutputPath(this->GetAdditionalCleanTargetName()), config);
      build.Variables["CONFIG"] = config;
      this->WriteBuild(os, build);
    }
    if (this->IsMultiConfig()) {
      build.Outputs.front() =
        this->NinjaOutputPath(this->GetAdditionalCleanTargetName());
      build.Variables["CONFIG"] = "";
      this->WriteBuild(os, build);
    }
  }
  // Return success
  return true;
}